

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O0

X509_ATTRIBUTE * X509_REQ_get_attr(X509_REQ *req,int loc)

{
  size_t sVar1;
  X509_ATTRIBUTE *pXVar2;
  int loc_local;
  X509_REQ *req_local;
  
  if (((req->req_info->attributes != (stack_st_X509_ATTRIBUTE *)0x0) && (-1 < loc)) &&
     (sVar1 = sk_X509_ATTRIBUTE_num((stack_st_X509_ATTRIBUTE *)req->req_info->attributes),
     (ulong)(long)loc < sVar1)) {
    pXVar2 = (X509_ATTRIBUTE *)
             sk_X509_ATTRIBUTE_value((stack_st_X509_ATTRIBUTE *)req->req_info->attributes,(long)loc)
    ;
    return pXVar2;
  }
  return (X509_ATTRIBUTE *)0x0;
}

Assistant:

X509_ATTRIBUTE *X509_REQ_get_attr(const X509_REQ *req, int loc) {
  if (req->req_info->attributes == NULL || loc < 0 ||
      sk_X509_ATTRIBUTE_num(req->req_info->attributes) <= (size_t)loc) {
    return NULL;
  }
  return sk_X509_ATTRIBUTE_value(req->req_info->attributes, loc);
}